

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O0

void nrnmutex(int on,Item *q)

{
  Item *in_RSI;
  int in_EDI;
  char *in_stack_ffffffffffffffe8;
  
  if (in_EDI == 1) {
    if (nrnmutex::toggle != 0) {
      diag((char *)in_RSI,in_stack_ffffffffffffffe8);
    }
    nrnmutex::toggle = 1;
    replacstr(in_RSI,in_stack_ffffffffffffffe8);
    protect_include_ = 1;
  }
  else if (in_EDI == 0) {
    if (nrnmutex::toggle != 1) {
      diag((char *)in_RSI,in_stack_ffffffffffffffe8);
    }
    nrnmutex::toggle = 0;
    replacstr(in_RSI,in_stack_ffffffffffffffe8);
    protect_include_ = 1;
  }
  else {
    if (nrnmutex::toggle != 0) {
      diag((char *)in_RSI,in_stack_ffffffffffffffe8);
    }
    nrnmutex::toggle = 0;
  }
  return;
}

Assistant:

void nrnmutex(int on, Item* q) { /* MUTEXLOCK or MUTEXUNLOCK */
	static int toggle = 0;
	if (on == 1) {
		if (toggle != 0) {
			diag("MUTEXLOCK invoked after MUTEXLOCK", (char*)0);
		}
		toggle = 1;
		replacstr(q, "");
		protect_include_ = 1;
	}else if (on == 0) {
		if (toggle != 1) {
			diag("MUTEXUNLOCK invoked with no earlier MUTEXLOCK", (char*)0);
		}
		toggle = 0;
		replacstr(q, "");
		protect_include_ = 1;
	}else{
		if (toggle != 0) {
			diag("MUTEXUNLOCK not invoked after MUTEXLOCK", (char*)0);
		}
		toggle = 0;
	}
}